

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_input_begin(nk_context *ctx)

{
  nk_vec2 nVar1;
  nk_input *in;
  int i;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x367b,"void nk_input_begin(struct nk_context *)");
  }
  if (ctx != (nk_context *)0x0) {
    for (in._4_4_ = 0; in._4_4_ < 4; in._4_4_ = in._4_4_ + 1) {
      *(undefined4 *)((ctx->style).cursors + (long)in._4_4_ * 2 + -0xd) = 0;
    }
    (ctx->input).keyboard.text_len = 0;
    nVar1 = nk_vec2(0.0,0.0);
    (ctx->input).mouse.scroll_delta = nVar1;
    (ctx->input).mouse.prev.x = (ctx->input).mouse.pos.x;
    (ctx->input).mouse.prev.y = (ctx->input).mouse.pos.y;
    (ctx->input).mouse.delta.x = 0.0;
    (ctx->input).mouse.delta.y = 0.0;
    for (in._4_4_ = 0; in._4_4_ < 0x1e; in._4_4_ = in._4_4_ + 1) {
      (ctx->input).keyboard.keys[in._4_4_].clicked = 0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_input_begin(struct nk_context *ctx)
{
    int i;
    struct nk_input *in;
    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;
    for (i = 0; i < NK_BUTTON_MAX; ++i)
        in->mouse.buttons[i].clicked = 0;

    in->keyboard.text_len = 0;
    in->mouse.scroll_delta = nk_vec2(0,0);
    in->mouse.prev.x = in->mouse.pos.x;
    in->mouse.prev.y = in->mouse.pos.y;
    in->mouse.delta.x = 0;
    in->mouse.delta.y = 0;
    for (i = 0; i < NK_KEY_MAX; i++)
        in->keyboard.keys[i].clicked = 0;
}